

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

char * __thiscall Assimp::CFIReaderImpl::getAttributeValue(CFIReaderImpl *this,int idx)

{
  pointer pAVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if ((-1 < idx) &&
     (pAVar1 = (this->attributes).
               super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_start,
     idx < (int)((ulong)((long)(this->attributes).
                               super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) >> 4) *
           0x38e38e39)) {
    iVar2 = (**(pAVar1[(uint)idx].value.
                super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_FIValue)();
    return *(char **)CONCAT44(extraout_var,iVar2);
  }
  return (char *)0x0;
}

Assistant:

virtual const char* getAttributeValue(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return nullptr;
        }
        return attributes[idx].value->toString().c_str();
    }